

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O2

void openInputIntervals(string *fPath,
                       vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                       *inp)

{
  char cVar1;
  ostream *poVar2;
  istream *piVar3;
  long *plVar4;
  int en;
  int st;
  string chr;
  undefined1 local_268 [40];
  fstream fs;
  
  std::fstream::fstream((string *)&fs);
  std::fstream::open((string *)&fs,(_Ios_Openmode)fPath);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Could not find input regions file at: ");
    poVar2 = std::operator<<(poVar2,(string *)fPath);
    std::operator<<(poVar2,'\n');
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"        Input regions file: ");
    poVar2 = std::operator<<(poVar2,(string *)fPath);
    std::operator<<(poVar2,'\n');
    chr._M_dataplus._M_p = (pointer)&chr.field_2;
    chr._M_string_length = 0;
    chr.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar3 = std::operator>>((istream *)&fs,(string *)&chr);
      piVar3 = (istream *)std::istream::operator>>(piVar3,&st);
      plVar4 = (long *)std::istream::operator>>(piVar3,&en);
      if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) break;
      local_268._0_4_ = en;
      local_268._4_4_ = st;
      std::__cxx11::string::string((string *)(local_268 + 8),(string *)&chr);
      std::
      vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>
      ::emplace_back<std::tuple<std::__cxx11::string,int,int>>
                ((vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>
                  *)inp,(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                         *)local_268);
      std::__cxx11::string::~string((string *)(local_268 + 8));
    }
    std::fstream::close();
    std::__cxx11::string::~string((string *)&chr);
  }
  std::fstream::~fstream(&fs);
  return;
}

Assistant:

void openInputIntervals(const std::string &fPath, std::vector<std::tuple<std::string, int, int>> &inp)
{
	std::fstream fs;
	fs.open(fPath, std::fstream::in);
	if (!fs.is_open())
	{
		std::cerr << "Could not find input regions file at: " << fPath << '\n';
		return;
	}
	else
	{
		std::cerr << "        Input regions file: " << fPath << '\n';
	}

	std::string chr;
	int st, en;

	while (fs >> chr >> st >> en)
	{
		inp.emplace_back(std::make_tuple(chr, st, en));
	}
	fs.close();
}